

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIsoFast.c
# Opt level: O0

Iso_Sto_t * Iso_StoStart(Aig_Man_t *pAig)

{
  int iVar1;
  Iso_Sto_t *pIVar2;
  Iso_Dat_t *pIVar3;
  Vec_Int_t *pVVar4;
  Vec_Ptr_t *pVVar5;
  int *piVar6;
  Iso_Sto_t *p;
  Aig_Man_t *pAig_local;
  
  pIVar2 = (Iso_Sto_t *)calloc(1,0x38);
  pIVar2->pAig = pAig;
  iVar1 = Aig_ManObjNumMax(pAig);
  pIVar2->nObjs = iVar1;
  pIVar3 = (Iso_Dat_t *)calloc((long)pIVar2->nObjs,4);
  pIVar2->pData = pIVar3;
  pVVar4 = Vec_IntStart(1000);
  pIVar2->vVisited = pVVar4;
  pVVar4 = Vec_IntStart(1000);
  pIVar2->vPlaces = pVVar4;
  pVVar5 = Vec_PtrStart(1000);
  pIVar2->vRoots = pVVar5;
  piVar6 = (int *)calloc(0x10000,4);
  pIVar2->pCounters = piVar6;
  return pIVar2;
}

Assistant:

Iso_Sto_t * Iso_StoStart( Aig_Man_t * pAig )
{
    Iso_Sto_t * p;
    p = ABC_CALLOC( Iso_Sto_t, 1 );
    p->pAig      = pAig;
    p->nObjs     = Aig_ManObjNumMax( pAig );
    p->pData     = ABC_CALLOC( Iso_Dat_t, p->nObjs );
    p->vVisited  = Vec_IntStart( 1000 );
    p->vPlaces   = Vec_IntStart( 1000 );
    p->vRoots    = Vec_PtrStart( 1000 );
    p->pCounters = ABC_CALLOC( int, (1 << AIG_ISO_NUM) );
    return p;
}